

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void OPNSetPres(FM_OPN *OPN,int pres,int timer_prescaler,int SSGpres)

{
  INT32 *pIVar1;
  undefined4 uVar2;
  DEVCB_SRATE_CHG p_Var3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [16];
  uint uVar9;
  INT32 (*paIVar10) [32];
  UINT8 *pUVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  
  if ((OPN->smpRateNative != '\0') && (p_Var3 = OPN->smpRateFunc, p_Var3 != (DEVCB_SRATE_CHG)0x0)) {
    uVar9 = (OPN->ST).clock / (uint)pres;
    (OPN->ST).rate = uVar9;
    (*p_Var3)(OPN->smpRateData,uVar9);
  }
  uVar9 = (OPN->ST).rate;
  if (uVar9 == 0) {
    dVar15 = 0.0;
  }
  else {
    dVar15 = ((double)(OPN->ST).clock / (double)uVar9) / (double)pres;
  }
  uVar14 = -(ulong)(ABS(dVar15 + -1.0) < 5e-05);
  dVar15 = (double)(~uVar14 & (ulong)dVar15 | uVar14 & 0x3ff0000000000000);
  (OPN->ST).freqbase = dVar15;
  OPN->eg_timer_add = (UINT32)(long)(dVar15 * 65536.0);
  OPN->eg_timer_overflow = 0x30000;
  OPN->lfo_timer_add = (UINT32)(long)(dVar15 * 16777216.0);
  (OPN->ST).timer_prescaler = timer_prescaler;
  if (SSGpres != 0) {
    (*(OPN->ST).SSG_funcs.set_clock)((OPN->ST).SSG_param,((OPN->ST).clock * 2) / (uint)SSGpres);
    dVar15 = (OPN->ST).freqbase;
  }
  paIVar10 = (OPN->ST).dt_tab + 4;
  pUVar11 = "";
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      uVar2 = *(undefined4 *)(pUVar11 + lVar13);
      uVar14 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar14;
      auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
      auVar5[8] = (char)((uint)uVar2 >> 0x10);
      auVar5._0_8_ = uVar14;
      auVar5[9] = 0;
      auVar5._10_3_ = auVar4._10_3_;
      auVar7._5_8_ = 0;
      auVar7._0_5_ = auVar5._8_5_;
      auVar6[4] = (char)((uint)uVar2 >> 8);
      auVar6._0_4_ = (int)uVar14;
      auVar6[5] = 0;
      auVar6._6_7_ = SUB137(auVar7 << 0x40,6);
      iVar16 = (int)((double)(int)uVar14 * dVar15 * 64.0);
      iVar17 = (int)((double)auVar6._4_4_ * dVar15 * 64.0);
      iVar18 = (int)((double)auVar5._8_4_ * dVar15 * 64.0);
      iVar19 = (int)((double)(uint3)(auVar4._10_3_ >> 0x10) * dVar15 * 64.0);
      *(ulong *)(paIVar10[-4] + lVar13) = CONCAT44(iVar17,iVar16);
      *(ulong *)(paIVar10[-4] + lVar13 + 2) = CONCAT44(iVar19,iVar18);
      pIVar1 = *paIVar10 + lVar13;
      *pIVar1 = -iVar16;
      pIVar1[1] = -iVar17;
      pIVar1[2] = -iVar18;
      pIVar1[3] = -iVar19;
      auVar8 = _DAT_00177560;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x20);
    lVar12 = lVar12 + 1;
    pUVar11 = pUVar11 + 0x20;
    paIVar10 = paIVar10 + 1;
  } while (lVar12 != 4);
  iVar16 = 0;
  iVar17 = 1;
  iVar18 = 2;
  iVar19 = 3;
  lVar12 = 0;
  do {
    auVar21._4_4_ = 0;
    auVar21._0_4_ = iVar16 << 5;
    auVar21._8_4_ = iVar17 << 5;
    auVar21._12_4_ = 0;
    auVar24._4_4_ = 0;
    auVar24._0_4_ = iVar18 << 5;
    auVar24._8_4_ = iVar19 << 5;
    auVar24._12_4_ = 0;
    dVar20 = (SUB168(auVar21 | auVar8,0) - auVar8._0_8_) * dVar15 * 64.0;
    dVar22 = (SUB168(auVar21 | auVar8,8) - auVar8._8_8_) * dVar15 * 64.0;
    dVar23 = (SUB168(auVar24 | auVar8,0) - auVar8._0_8_) * dVar15 * 64.0;
    dVar25 = (SUB168(auVar24 | auVar8,8) - auVar8._8_8_) * dVar15 * 64.0;
    iVar26 = (int)dVar23;
    iVar28 = (int)dVar25;
    iVar27 = (int)dVar20;
    iVar29 = (int)dVar22;
    *(ulong *)(OPN->fn_table + lVar12) =
         CONCAT44((int)(dVar22 - 2147483648.0),(int)(dVar20 - 2147483648.0)) &
         CONCAT44(iVar29 >> 0x1f,iVar27 >> 0x1f) | CONCAT44(iVar29,iVar27);
    *(ulong *)(OPN->fn_table + lVar12 + 2) =
         CONCAT44((int)(dVar25 - 2147483648.0),(int)(dVar23 - 2147483648.0)) &
         CONCAT44(iVar28 >> 0x1f,iVar26 >> 0x1f) | CONCAT44(iVar28,iVar26);
    lVar12 = lVar12 + 4;
    iVar16 = iVar16 + 4;
    iVar17 = iVar17 + 4;
    iVar18 = iVar18 + 4;
    iVar19 = iVar19 + 4;
  } while (lVar12 != 0x1000);
  OPN->fn_max = (UINT32)(long)(dVar15 * 131072.0 * 64.0);
  return;
}

Assistant:

static void OPNSetPres(FM_OPN *OPN, int pres, int timer_prescaler, int SSGpres)
{
	if (OPN->smpRateNative && OPN->smpRateFunc != NULL)
	{
		OPN->ST.rate = OPN->ST.clock / pres;
		if (OPN->smpRateFunc != NULL)
			OPN->smpRateFunc(OPN->smpRateData, OPN->ST.rate);
	}

	/* frequency base */
	OPN->ST.freqbase = (OPN->ST.rate) ? ((double)OPN->ST.clock / OPN->ST.rate) / pres : 0;
	if (fabs(OPN->ST.freqbase - 1.0) < 0.00005)
		OPN->ST.freqbase = 1.0;

#if 0
	OPN->ST.rate = (double)OPN->ST.clock / pres;
	OPN->ST.freqbase = 1.0;
#endif

	/* EG is updated every 3 samples */
	OPN->eg_timer_add  = (UINT32)((1<<EG_SH) * OPN->ST.freqbase);
	OPN->eg_timer_overflow = ( 3 ) * (1<<EG_SH);

	/* LFO timer increment (every samples) */
	OPN->lfo_timer_add  = (UINT32)((1<<LFO_SH) * OPN->ST.freqbase);

	/* Timer base time */
	OPN->ST.timer_prescaler = timer_prescaler;

	/* SSG part  prescaler set */
	if( SSGpres ) OPN->ST.SSG_funcs.set_clock( OPN->ST.SSG_param, OPN->ST.clock * 2 / SSGpres );

	/* make time tables */
	init_timetables( OPN );
}